

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigRet.c
# Opt level: O2

void Rtm_ObjAddFirst(Rtm_Man_t *p,Rtm_Edg_t *pEdge,Rtm_Init_t Val)

{
  Rtm_Init_t *pRVar1;
  uint uVar2;
  Rtm_Init_t RVar3;
  Rtm_Init_t *pRVar4;
  uint uVar5;
  
  if ((*(uint *)pEdge & 0xfff) == 10) {
    Rtm_ObjTransferToBig(p,pEdge);
  }
  else if ((~*(uint *)pEdge & 0xf) == 0) {
    Rtm_ObjTransferToBigger(p,pEdge);
  }
  uVar2 = *(uint *)pEdge;
  uVar5 = uVar2 + 1 & 0xfff;
  if ((uVar2 & 0xffe) < 10) {
    *(Rtm_Init_t *)pEdge = (uVar2 >> 10 & 0xffffc | Val) << 0xc | uVar5;
  }
  else {
    pRVar4 = p->pExtra + (uVar2 >> 0xc);
    *(uint *)pEdge = uVar2 & 0xfffff000 | uVar5;
    pRVar1 = pRVar4 + (((uVar5 >> 4) + 1) - (uint)((uVar2 + 1 & 0xf) == 0));
    for (; pRVar4 < pRVar1; pRVar4 = pRVar4 + 1) {
      RVar3 = *pRVar4;
      *pRVar4 = RVar3 << 2 | Val;
      Val = RVar3 >> 0x1e;
    }
  }
  return;
}

Assistant:

static        void        Rtm_ObjAddFirst( Rtm_Man_t * p, Rtm_Edg_t * pEdge, Rtm_Init_t Val )  { if ( pEdge->nLats == 10 ) Rtm_ObjTransferToBig(p, pEdge); else if ( (pEdge->nLats & 15) == 15 ) Rtm_ObjTransferToBigger(p, pEdge); if ( pEdge->nLats >= 10 ) Rtm_ObjAddFirst2(p, pEdge, Val); else Rtm_ObjAddFirst1(pEdge, Val); }